

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O0

map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
ConfigManager::
Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ReadConfigurations(Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *this)

{
  long *this_00;
  long in_RSI;
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  char *what;
  exception *e;
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffef8;
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff00;
  string local_78;
  undefined1 local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10b7fc);
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))(local_48);
  std::
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10b839);
  this_00 = *(long **)(in_RSI + 0x30);
  LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>::GetLogMessage<char_const[19]>
            (&local_78,this_00,"[%s] - Configuration successfuly readed",
             (char (*) [19])"ReadConfigurations");
  (**(code **)(*this_00 + 0x10))(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return in_RDI;
}

Assistant:

const std::map<Enums::Configurations, T> ReadConfigurations() override
        {
            auto result = std::map<Enums::Configurations, T>();

            try
            {
                result = m_config_behavior->ReadConfigurations();

                m_logger->LogInfo(
                            m_logger->GetLogMessage(
                                "[%s] - Configuration successfuly readed", __func__));
            }
            catch (std::exception& e)
            {
                char* what;
                strcpy(what, e.what());
                m_logger->LogError(m_logger->GetLogMessage("[%s] - %s", __func__, what));
            }
            catch(...)
            {
                m_logger->LogError(m_logger->GetLogMessage("[%s] - Unknown error", __func__));
            }

            return result;
        }